

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::IsHistogramOtherBinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  duckdb *this;
  Vector ref;
  Value v;
  Vector aVStack_c8 [8];
  LogicalType local_c0 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  duckdb local_60 [64];
  
  this = (duckdb *)aVStack_c8;
  pvVar2 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  bVar1 = SupportsOtherBucket((LogicalType *)(pvVar2 + 8));
  if (bVar1) {
    OtherBucketValue(local_60,(LogicalType *)(pvVar2 + 8));
    duckdb::Vector::Vector(aVStack_c8,(Value *)local_60);
    pvVar2 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::VectorOperations::NotDistinctFrom(pvVar2,aVStack_c8,result,*(ulong *)(args + 0x18));
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    duckdb::LogicalType::~LogicalType(local_c0);
    this = local_60;
  }
  else {
    duckdb::Value::BOOLEAN(SUB81(aVStack_c8,0));
    duckdb::Vector::Reference((Value *)result);
  }
  duckdb::Value::~Value((Value *)this);
  return;
}

Assistant:

static void IsHistogramOtherBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_type = args.data[0].GetType();
	if (!SupportsOtherBucket(input_type)) {
		result.Reference(Value::BOOLEAN(false));
		return;
	}
	auto v = OtherBucketValue(input_type);
	Vector ref(v);
	VectorOperations::NotDistinctFrom(args.data[0], ref, result, args.size());
}